

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  Fts5Config *pFVar1;
  int iVar2;
  sqlite3_value *pValue;
  int local_3c;
  int rc;
  Fts5Cursor *pCsr;
  Fts5Config *pConfig;
  Fts5FullTable *pTab;
  int iCol_local;
  sqlite3_context *pCtx_local;
  sqlite3_vtab_cursor *pCursor_local;
  
  pFVar1 = (((Fts5FullTable *)pCursor->pVtab)->p).pConfig;
  local_3c = 0;
  if (*(int *)&pCursor[4].pVtab == 3) {
    if (iCol == pFVar1->nCol) {
      sqlite3_result_int64(pCtx,(i64)pCursor[0xb].pVtab);
    }
  }
  else if (iCol == pFVar1->nCol) {
    sqlite3_result_int64(pCtx,(i64)pCursor[3].pVtab);
  }
  else if (iCol == pFVar1->nCol + 1) {
    if (*(int *)&pCursor[4].pVtab == 2) {
      fts5PoslistBlob(pCtx,(Fts5Cursor *)pCursor);
    }
    else if (((*(int *)&pCursor[4].pVtab == 1) || (*(int *)&pCursor[4].pVtab == 4)) &&
            ((pCursor[0xe].pVtab != (sqlite3_vtab *)0x0 ||
             (local_3c = fts5FindRankFunction((Fts5Cursor *)pCursor), local_3c == 0)))) {
      fts5ApiInvoke((Fts5Auxiliary *)pCursor[0xe].pVtab,(Fts5Cursor *)pCursor,pCtx,
                    *(int *)&pCursor[0xf].pVtab,(sqlite3_value **)pCursor[0x10].pVtab);
    }
  }
  else {
    iVar2 = fts5IsContentless((Fts5FullTable *)pCursor->pVtab);
    if ((iVar2 == 0) && (local_3c = fts5SeekCursor((Fts5Cursor *)pCursor,1), local_3c == 0)) {
      pValue = sqlite3_column_value((sqlite3_stmt *)pCursor[7].pVtab,iCol + 1);
      sqlite3_result_value(pCtx,pValue);
    }
  }
  return local_3c;
}

Assistant:

static int fts5ColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc = SQLITE_OK;
  
  assert( CsrFlagTest(pCsr, FTS5CSR_EOF)==0 );

  if( pCsr->ePlan==FTS5_PLAN_SPECIAL ){
    if( iCol==pConfig->nCol ){
      sqlite3_result_int64(pCtx, pCsr->iSpecial);
    }
  }else

  if( iCol==pConfig->nCol ){
    /* User is requesting the value of the special column with the same name
    ** as the table. Return the cursor integer id number. This value is only
    ** useful in that it may be passed as the first argument to an FTS5
    ** auxiliary function.  */
    sqlite3_result_int64(pCtx, pCsr->iCsrId);
  }else if( iCol==pConfig->nCol+1 ){

    /* The value of the "rank" column. */
    if( pCsr->ePlan==FTS5_PLAN_SOURCE ){
      fts5PoslistBlob(pCtx, pCsr);
    }else if( 
        pCsr->ePlan==FTS5_PLAN_MATCH
     || pCsr->ePlan==FTS5_PLAN_SORTED_MATCH
    ){
      if( pCsr->pRank || SQLITE_OK==(rc = fts5FindRankFunction(pCsr)) ){
        fts5ApiInvoke(pCsr->pRank, pCsr, pCtx, pCsr->nRankArg, pCsr->apRankArg);
      }
    }
  }else if( !fts5IsContentless(pTab) ){
    rc = fts5SeekCursor(pCsr, 1);
    if( rc==SQLITE_OK ){
      sqlite3_result_value(pCtx, sqlite3_column_value(pCsr->pStmt, iCol+1));
    }
  }
  return rc;
}